

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tiny_obj_loader.h
# Opt level: O1

bool tinyobj::LoadObj(attrib_t *attrib,
                     vector<tinyobj::shape_t,_std::allocator<tinyobj::shape_t>_> *shapes,
                     vector<tinyobj::material_t,_std::allocator<tinyobj::material_t>_> *materials,
                     string *warn,string *err,char *filename,char *mtl_basedir,bool trianglulate,
                     bool default_vcols_fallback)

{
  size_type *psVar1;
  pointer pfVar2;
  pointer psVar3;
  pointer psVar4;
  char cVar5;
  undefined8 this;
  bool bVar6;
  size_t sVar7;
  char *pcVar8;
  pointer this_00;
  long local_428;
  ifstream ifs;
  byte abStack_408 [488];
  stringstream local_220 [8];
  stringstream errss;
  long local_210 [14];
  ios_base local_1a0 [264];
  string *local_98;
  vector<tinyobj::material_t,_std::allocator<tinyobj::material_t>_> *local_90;
  char *local_88;
  MaterialReader local_80;
  MaterialFileReader matFileReader;
  string baseDir;
  
  pfVar2 = (attrib->vertices).super__Vector_base<float,_std::allocator<float>_>._M_impl.
           super__Vector_impl_data._M_start;
  if ((attrib->vertices).super__Vector_base<float,_std::allocator<float>_>._M_impl.
      super__Vector_impl_data._M_finish != pfVar2) {
    (attrib->vertices).super__Vector_base<float,_std::allocator<float>_>._M_impl.
    super__Vector_impl_data._M_finish = pfVar2;
  }
  pfVar2 = (attrib->normals).super__Vector_base<float,_std::allocator<float>_>._M_impl.
           super__Vector_impl_data._M_start;
  if ((attrib->normals).super__Vector_base<float,_std::allocator<float>_>._M_impl.
      super__Vector_impl_data._M_finish != pfVar2) {
    (attrib->normals).super__Vector_base<float,_std::allocator<float>_>._M_impl.
    super__Vector_impl_data._M_finish = pfVar2;
  }
  pfVar2 = (attrib->texcoords).super__Vector_base<float,_std::allocator<float>_>._M_impl.
           super__Vector_impl_data._M_start;
  if ((attrib->texcoords).super__Vector_base<float,_std::allocator<float>_>._M_impl.
      super__Vector_impl_data._M_finish != pfVar2) {
    (attrib->texcoords).super__Vector_base<float,_std::allocator<float>_>._M_impl.
    super__Vector_impl_data._M_finish = pfVar2;
  }
  pfVar2 = (attrib->colors).super__Vector_base<float,_std::allocator<float>_>._M_impl.
           super__Vector_impl_data._M_start;
  if ((attrib->colors).super__Vector_base<float,_std::allocator<float>_>._M_impl.
      super__Vector_impl_data._M_finish != pfVar2) {
    (attrib->colors).super__Vector_base<float,_std::allocator<float>_>._M_impl.
    super__Vector_impl_data._M_finish = pfVar2;
  }
  psVar3 = (shapes->super__Vector_base<tinyobj::shape_t,_std::allocator<tinyobj::shape_t>_>)._M_impl
           .super__Vector_impl_data._M_start;
  psVar4 = (shapes->super__Vector_base<tinyobj::shape_t,_std::allocator<tinyobj::shape_t>_>)._M_impl
           .super__Vector_impl_data._M_finish;
  this_00 = psVar3;
  local_98 = warn;
  local_90 = materials;
  pcVar8 = filename;
  baseDir.field_2._8_8_ = err;
  if (psVar4 != psVar3) {
    do {
      local_88 = pcVar8;
      shape_t::~shape_t(this_00);
      this_00 = this_00 + 1;
      pcVar8 = local_88;
    } while (this_00 != psVar4);
    (shapes->super__Vector_base<tinyobj::shape_t,_std::allocator<tinyobj::shape_t>_>)._M_impl.
    super__Vector_impl_data._M_finish = psVar3;
    filename = local_88;
  }
  std::__cxx11::stringstream::stringstream(local_220);
  std::ifstream::ifstream(&local_428,filename,_S_in);
  if ((abStack_408[*(long *)(local_428 + -0x18)] & 5) == 0) {
    pcVar8 = "";
    if (mtl_basedir != (char *)0x0) {
      pcVar8 = mtl_basedir;
    }
    matFileReader.m_mtlBaseDir.field_2._8_8_ = &baseDir._M_string_length;
    sVar7 = strlen(pcVar8);
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)((long)&matFileReader.m_mtlBaseDir.field_2 + 8),pcVar8,pcVar8 + sVar7);
    if ((baseDir._M_dataplus._M_p != (pointer)0x0) &&
       (baseDir._M_dataplus._M_p[matFileReader.m_mtlBaseDir.field_2._8_8_ + -1] != '/')) {
      std::__cxx11::string::push_back((char)&matFileReader + ' ');
    }
    local_80._vptr_MaterialReader = (_func_int **)&PTR__MaterialFileReader_0019dbe8;
    psVar1 = &matFileReader.m_mtlBaseDir._M_string_length;
    matFileReader.super_MaterialReader._vptr_MaterialReader = (_func_int **)psVar1;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&matFileReader,matFileReader.m_mtlBaseDir.field_2._8_8_,
               baseDir._M_dataplus._M_p + matFileReader.m_mtlBaseDir.field_2._8_8_);
    bVar6 = LoadObj(attrib,shapes,local_90,local_98,(string *)baseDir.field_2._8_8_,
                    (istream *)&local_428,&local_80,trianglulate,default_vcols_fallback);
    local_80._vptr_MaterialReader = (_func_int **)&PTR__MaterialFileReader_0019dbe8;
    if (matFileReader.super_MaterialReader._vptr_MaterialReader != (_func_int **)psVar1) {
      operator_delete(matFileReader.super_MaterialReader._vptr_MaterialReader,
                      matFileReader.m_mtlBaseDir._M_string_length + 1);
    }
    if ((size_type *)matFileReader.m_mtlBaseDir.field_2._8_8_ != &baseDir._M_string_length) {
      operator_delete((void *)matFileReader.m_mtlBaseDir.field_2._8_8_,baseDir._M_string_length + 1)
      ;
    }
  }
  else {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_210,"Cannot open file [",0x12);
    this = baseDir.field_2._8_8_;
    if (filename == (char *)0x0) {
      std::ios::clear((int)(ostream *)local_210 + (int)*(undefined8 *)(local_210[0] + -0x18));
    }
    else {
      sVar7 = strlen(filename);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_210,filename,sVar7);
    }
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_210,"]",1);
    cVar5 = (char)(ostream *)local_210;
    std::ios::widen((char)*(undefined8 *)(local_210[0] + -0x18) + cVar5);
    std::ostream::put(cVar5);
    std::ostream::flush();
    if (this != 0) {
      std::__cxx11::stringbuf::str();
      std::__cxx11::string::operator=((string *)this,(string *)&local_80);
      if ((string *)local_80._vptr_MaterialReader != &matFileReader.m_mtlBaseDir) {
        operator_delete(local_80._vptr_MaterialReader,
                        (ulong)(matFileReader.m_mtlBaseDir._M_dataplus._M_p + 1));
      }
    }
    bVar6 = false;
  }
  std::ifstream::~ifstream(&local_428);
  std::__cxx11::stringstream::~stringstream(local_220);
  std::ios_base::~ios_base(local_1a0);
  return bVar6;
}

Assistant:

bool LoadObj(attrib_t *attrib, std::vector<shape_t> *shapes,
             std::vector<material_t> *materials, std::string *warn,
             std::string *err, const char *filename, const char *mtl_basedir,
             bool trianglulate, bool default_vcols_fallback) {
  attrib->vertices.clear();
  attrib->normals.clear();
  attrib->texcoords.clear();
  attrib->colors.clear();
  shapes->clear();

  std::stringstream errss;

  std::ifstream ifs(filename);
  if (!ifs) {
    errss << "Cannot open file [" << filename << "]" << std::endl;
    if (err) {
      (*err) = errss.str();
    }
    return false;
  }

  std::string baseDir = mtl_basedir ? mtl_basedir : "";
  if (!baseDir.empty()) {
#ifndef _WIN32
    const char dirsep = '/';
#else
    const char dirsep = '\\';
#endif
    if (baseDir[baseDir.length() - 1] != dirsep) baseDir += dirsep;
  }
  MaterialFileReader matFileReader(baseDir);

  return LoadObj(attrib, shapes, materials, warn, err, &ifs, &matFileReader,
                 trianglulate, default_vcols_fallback);
}